

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O2

int Nm_ManFindIdByNameTwoTypes(Nm_Man_t *p,char *pName,int Type1,int Type2)

{
  int iVar1;
  
  iVar1 = Nm_ManFindIdByName(p,pName,Type1);
  if (iVar1 != -1) {
    return iVar1;
  }
  iVar1 = Nm_ManFindIdByName(p,pName,Type2);
  return iVar1;
}

Assistant:

int Nm_ManFindIdByNameTwoTypes( Nm_Man_t * p, char * pName, int Type1, int Type2 )
{
    int iNodeId;
    iNodeId = Nm_ManFindIdByName( p, pName, Type1 );
    if ( iNodeId == -1 )
        iNodeId = Nm_ManFindIdByName( p, pName, Type2 );
    if ( iNodeId == -1 )
        return -1;
    return iNodeId;
}